

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.h
# Opt level: O3

void __thiscall
slang::ast::MinTypMaxExpression::visitExprs<CollectLHSSymbols&>
          (MinTypMaxExpression *this,AlwaysFFVisitor *visitor)

{
  Expression::visitExpression<slang::ast::Expression_const,CollectLHSSymbols&>
            (this->min_,this->min_,visitor);
  Expression::visitExpression<slang::ast::Expression_const,CollectLHSSymbols&>
            (this->typ_,this->typ_,visitor);
  Expression::visitExpression<slang::ast::Expression_const,CollectLHSSymbols&>
            (this->max_,this->max_,visitor);
  return;
}

Assistant:

decltype(auto) visitExprs(TVisitor&& visitor) const {
        min().visit(visitor);
        typ().visit(visitor);
        max().visit(visitor);
    }